

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool leveldb::Version::RecordReadSample(leveldb::Slice)::State::Match(void*,int,leveldb::
     FileMetaData__(void *arg,int level,FileMetaData *f)

{
  State *state;
  FileMetaData *f_local;
  int level_local;
  void *arg_local;
  
  *(int *)((long)arg + 0x10) = *(int *)((long)arg + 0x10) + 1;
  if (*(int *)((long)arg + 0x10) == 1) {
    *(FileMetaData **)arg = f;
    *(int *)((long)arg + 8) = level;
  }
  return *(int *)((long)arg + 0x10) < 2;
}

Assistant:

static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);
      state->matches++;
      if (state->matches == 1) {
        // Remember first match.
        state->stats.seek_file = f;
        state->stats.seek_file_level = level;
      }
      // We can stop iterating once we have a second match.
      return state->matches < 2;
    }